

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

bool __thiscall
flatbuffers::python::PythonGenerator::generateEnums(PythonGenerator *this,string *one_file_code)

{
  _Base_ptr *pp_Var1;
  Parser *pPVar2;
  EnumDef *enum_def;
  IdlNamer *pIVar3;
  bool bVar4;
  pointer ppEVar5;
  bool bVar6;
  string enumcode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string mod;
  string local_d0;
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  string *local_80;
  IdlNamer *local_78;
  string local_70;
  string local_50;
  
  pPVar2 = (this->super_BaseGenerator).parser_;
  ppEVar5 = (pPVar2->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar6 = ppEVar5 ==
          (pPVar2->enums_).vec.
          super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (!bVar6) {
    local_78 = &this->namer_;
    local_80 = one_file_code;
    do {
      enum_def = *ppEVar5;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      GenEnum(this,enum_def,&local_d0);
      if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api &
          enum_def->is_union) != 0) {
        GenUnionCreator(this,enum_def,&local_d0);
      }
      pIVar3 = local_78;
      if (((((this->super_BaseGenerator).parser_)->opts).one_file == true) &&
         (local_d0._M_string_length != 0)) {
        pp_Var1 = &local_b0._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_b0._M_impl._0_8_ = pp_Var1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_d0._M_dataplus._M_p,
                   local_d0._M_dataplus._M_p + local_d0._M_string_length);
        std::__cxx11::string::append((char *)&local_b0);
        std::__cxx11::string::_M_append((char *)local_80,local_b0._M_impl._0_8_);
        if ((_Base_ptr *)local_b0._M_impl._0_8_ != pp_Var1) {
          operator_delete((void *)local_b0._M_impl._0_8_,
                          (ulong)((long)&(local_b0._M_impl.super__Rb_tree_header._M_header._M_parent
                                         )->_M_color + 1));
        }
      }
      else {
        local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_b0._M_impl.super__Rb_tree_header._M_header;
        local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
        (*(local_78->super_Namer)._vptr_Namer[0xc])(&local_70,local_78,enum_def,3);
        (*(pIVar3->super_Namer)._vptr_Namer[0xc])(&local_50,pIVar3,enum_def,1);
        bVar4 = SaveType(this,&local_50,(enum_def->super_Definition).defined_namespace,&local_d0,
                         (ImportMap *)&local_b0,&local_70,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_b0);
        if (!bVar4) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
            return bVar6;
          }
          operator_delete(local_d0._M_dataplus._M_p,
                          CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                   local_d0.field_2._M_local_buf[0]) + 1);
          return bVar6;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      ppEVar5 = ppEVar5 + 1;
      bVar6 = ppEVar5 ==
              (((this->super_BaseGenerator).parser_)->enums_).vec.
              super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar6);
  }
  return bVar6;
}

Assistant:

bool generateEnums(std::string *one_file_code) const {
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      auto &enum_def = **it;
      std::string enumcode;
      GenEnum(enum_def, &enumcode);
      if (parser_.opts.generate_object_based_api & enum_def.is_union) {
        GenUnionCreator(enum_def, &enumcode);
      }

      if (parser_.opts.one_file && !enumcode.empty()) {
        *one_file_code += enumcode + "\n\n";
      } else {
        ImportMap imports;
        const std::string mod =
            namer_.File(enum_def, SkipFile::SuffixAndExtension);

        if (!SaveType(namer_.File(enum_def, SkipFile::Suffix),
                      *enum_def.defined_namespace, enumcode, imports, mod,
                      false))
          return false;
      }
    }
    return true;
  }